

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

void nn_queue_push(nn_queue *self,nn_queue_item *item)

{
  if (item->next == (nn_queue_item *)0xffffffffffffffff) {
    item->next = (nn_queue_item *)0x0;
    if (self->head == (nn_queue_item *)0x0) {
      self->head = item;
    }
    if (self->tail != (nn_queue_item *)0x0) {
      self->tail->next = item;
    }
    self->tail = item;
    return;
  }
  nn_queue_push_cold_1();
}

Assistant:

void nn_queue_push (struct nn_queue *self, struct nn_queue_item *item)
{
    nn_assert (item->next == NN_QUEUE_NOTINQUEUE);

    item->next = NULL;
    if (!self->head)
        self->head = item;
    if (self->tail)
        self->tail->next = item;
    self->tail = item;
}